

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O2

void sec_dalloc(tsdn_t *tsdn,pai_t *self,edata_t *edata,_Bool *deferred_work_generated)

{
  sec_bin_t *psVar1;
  edata_t *peVar2;
  long lVar3;
  sec_shard_t *shard;
  ulong uVar4;
  _func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool_ptr *p_Var5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  
  if ((self[1].alloc_batch !=
       (_func_size_t_tsdn_t_ptr_pai_t_ptr_size_t_size_t_edata_list_active_t_ptr__Bool__Bool_ptr *)
       0x0) && ((_func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool__Bool_ptr *)
                ((edata->field_2).e_size_esn & 0xfffffffffffff000) <= self[1].expand)) {
    shard = sec_shard_pick(tsdn,(sec_t *)self);
    malloc_mutex_lock(tsdn,&shard->mtx);
    if (shard->enabled == true) {
      uVar4 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
      if (uVar4 < 0x7000000000000001) {
        uVar8 = uVar4 - 1;
        lVar3 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar7 = (uint)lVar3 ^ 0x3f;
        iVar9 = 0x32 - uVar7;
        if (0x32 < uVar7) {
          iVar9 = 0;
        }
        bVar6 = 0xc;
        if (0x4000 < uVar4) {
          bVar6 = (char)iVar9 + 0xb;
        }
        uVar8 = (ulong)(((uint)(uVar8 >> (bVar6 & 0x3f)) & 3) + iVar9 * 4);
      }
      else {
        uVar8 = 199;
      }
      psVar1 = shard->bins;
      (edata->field_5).ql_link_active.qre_next = edata;
      (edata->field_5).ql_link_active.qre_prev = edata;
      peVar2 = psVar1[uVar8].freelist.head.qlh_first;
      if (peVar2 != (edata_t *)0x0) {
        (edata->field_5).ql_link_active.qre_next = (peVar2->field_5).ql_link_active.qre_prev;
        ((psVar1[uVar8].freelist.head.qlh_first)->field_5).ql_link_active.qre_prev = edata;
        (edata->field_5).ql_link_active.qre_prev =
             (((edata->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next;
        peVar2 = psVar1[uVar8].freelist.head.qlh_first;
        (((peVar2->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar2;
        (((edata->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = edata;
      }
      psVar1[uVar8].freelist.head.qlh_first = edata;
      psVar1[uVar8].bytes_cur = psVar1[uVar8].bytes_cur + uVar4;
      p_Var5 = (_func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool_ptr *)
               (uVar4 + shard->bytes_cur);
      shard->bytes_cur = (size_t)p_Var5;
      if (self[1].shrink < p_Var5) {
        sec_flush_some_and_unlock(tsdn,(sec_t *)self,shard);
        return;
      }
      (shard->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(shard->mtx).field_0 + 0x48));
      return;
    }
    (shard->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(shard->mtx).field_0 + 0x48));
  }
  (**(code **)(self[1].alloc + 0x20))(tsdn,self[1].alloc,edata,deferred_work_generated);
  return;
}

Assistant:

static void
sec_dalloc(tsdn_t *tsdn, pai_t *self, edata_t *edata,
    bool *deferred_work_generated) {
	sec_t *sec = (sec_t *)self;
	if (sec->opts.nshards == 0
	    || edata_size_get(edata) > sec->opts.max_alloc) {
		pai_dalloc(tsdn, sec->fallback, edata,
		    deferred_work_generated);
		return;
	}
	sec_shard_t *shard = sec_shard_pick(tsdn, sec);
	malloc_mutex_lock(tsdn, &shard->mtx);
	if (shard->enabled) {
		sec_shard_dalloc_and_unlock(tsdn, sec, shard, edata);
	} else {
		malloc_mutex_unlock(tsdn, &shard->mtx);
		pai_dalloc(tsdn, sec->fallback, edata,
		    deferred_work_generated);
	}
}